

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

ParameterizedTestCaseInfo<PushPopTest> * __thiscall
testing::internal::ParameterizedTestCaseRegistry::GetTestCasePatternHolder<PushPopTest>
          (ParameterizedTestCaseRegistry *this,char *test_case_name,CodeLocation *code_location)

{
  pointer *pppPVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  iterator __position;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ParameterizedTestCaseInfo<PushPopTest> *this_00;
  pointer ppPVar5;
  ParameterizedTestCaseInfo<PushPopTest> *local_80;
  CodeLocation local_78;
  CodeLocation local_50;
  
  ppPVar5 = (this->test_case_infos_).
            super__Vector_base<testing::internal::ParameterizedTestCaseInfoBase_*,_std::allocator<testing::internal::ParameterizedTestCaseInfoBase_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppPVar5 ==
      (this->test_case_infos_).
      super__Vector_base<testing::internal::ParameterizedTestCaseInfoBase_*,_std::allocator<testing::internal::ParameterizedTestCaseInfoBase_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    this_00 = (ParameterizedTestCaseInfo<PushPopTest> *)0x0;
  }
  else {
    this_00 = (ParameterizedTestCaseInfo<PushPopTest> *)0x0;
    do {
      iVar4 = (*(*ppPVar5)->_vptr_ParameterizedTestCaseInfoBase[2])();
      iVar4 = std::__cxx11::string::compare((char *)CONCAT44(extraout_var,iVar4));
      if (iVar4 == 0) {
        iVar4 = (*(*ppPVar5)->_vptr_ParameterizedTestCaseInfoBase[3])();
        if ((undefined1 *)CONCAT44(extraout_var_00,iVar4) != &TypeIdHelper<PushPopTest>::dummy_) {
          paVar2 = &local_50.file.field_2;
          pcVar3 = (code_location->file)._M_dataplus._M_p;
          local_50.file._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_50,pcVar3,pcVar3 + (code_location->file)._M_string_length);
          local_50.line = code_location->line;
          ReportInvalidTestCaseType(test_case_name,&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50.file._M_dataplus._M_p != paVar2) {
            operator_delete(local_50.file._M_dataplus._M_p);
          }
          abort();
        }
        this_00 = CheckedDowncastToActualType<testing::internal::ParameterizedTestCaseInfo<PushPopTest>,testing::internal::ParameterizedTestCaseInfoBase>
                            (*ppPVar5);
        break;
      }
      ppPVar5 = ppPVar5 + 1;
    } while (ppPVar5 !=
             (this->test_case_infos_).
             super__Vector_base<testing::internal::ParameterizedTestCaseInfoBase_*,_std::allocator<testing::internal::ParameterizedTestCaseInfoBase_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (this_00 == (ParameterizedTestCaseInfo<PushPopTest> *)0x0) {
    this_00 = (ParameterizedTestCaseInfo<PushPopTest> *)operator_new(0x80);
    paVar2 = &local_78.file.field_2;
    pcVar3 = (code_location->file)._M_dataplus._M_p;
    local_78.file._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_78,pcVar3,pcVar3 + (code_location->file)._M_string_length);
    local_78.line = code_location->line;
    ParameterizedTestCaseInfo<PushPopTest>::ParameterizedTestCaseInfo
              (this_00,test_case_name,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78.file._M_dataplus._M_p != paVar2) {
      operator_delete(local_78.file._M_dataplus._M_p);
    }
    __position._M_current =
         (this->test_case_infos_).
         super__Vector_base<testing::internal::ParameterizedTestCaseInfoBase_*,_std::allocator<testing::internal::ParameterizedTestCaseInfoBase_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->test_case_infos_).
        super__Vector_base<testing::internal::ParameterizedTestCaseInfoBase_*,_std::allocator<testing::internal::ParameterizedTestCaseInfoBase_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      local_80 = this_00;
      std::
      vector<testing::internal::ParameterizedTestCaseInfoBase*,std::allocator<testing::internal::ParameterizedTestCaseInfoBase*>>
      ::_M_realloc_insert<testing::internal::ParameterizedTestCaseInfoBase*>
                ((vector<testing::internal::ParameterizedTestCaseInfoBase*,std::allocator<testing::internal::ParameterizedTestCaseInfoBase*>>
                  *)this,__position,(ParameterizedTestCaseInfoBase **)&local_80);
    }
    else {
      *__position._M_current = (ParameterizedTestCaseInfoBase *)this_00;
      pppPVar1 = &(this->test_case_infos_).
                  super__Vector_base<testing::internal::ParameterizedTestCaseInfoBase_*,_std::allocator<testing::internal::ParameterizedTestCaseInfoBase_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppPVar1 = *pppPVar1 + 1;
    }
  }
  return this_00;
}

Assistant:

ParameterizedTestCaseInfo<TestCase>* GetTestCasePatternHolder(
      const char* test_case_name,
      CodeLocation code_location) {
    ParameterizedTestCaseInfo<TestCase>* typed_test_info = NULL;
    for (TestCaseInfoContainer::iterator it = test_case_infos_.begin();
         it != test_case_infos_.end(); ++it) {
      if ((*it)->GetTestCaseName() == test_case_name) {
        if ((*it)->GetTestCaseTypeId() != GetTypeId<TestCase>()) {
          // Complain about incorrect usage of Google Test facilities
          // and terminate the program since we cannot guaranty correct
          // test case setup and tear-down in this case.
          ReportInvalidTestCaseType(test_case_name, code_location);
          posix::Abort();
        } else {
          // At this point we are sure that the object we found is of the same
          // type we are looking for, so we downcast it to that type
          // without further checks.
          typed_test_info = CheckedDowncastToActualType<
              ParameterizedTestCaseInfo<TestCase> >(*it);
        }
        break;
      }
    }
    if (typed_test_info == NULL) {
      typed_test_info = new ParameterizedTestCaseInfo<TestCase>(
          test_case_name, code_location);
      test_case_infos_.push_back(typed_test_info);
    }
    return typed_test_info;
  }